

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSphereBoxCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btSphereBoxCollisionAlgorithm::btSphereBoxCollisionAlgorithm
          (btSphereBoxCollisionAlgorithm *this,btPersistentManifold *mf,
          btCollisionAlgorithmConstructionInfo *ci,btCollisionObjectWrapper *col0Wrap,
          btCollisionObjectWrapper *col1Wrap,bool isSwapped)

{
  byte bVar1;
  btCollisionObject *pbVar2;
  btCollisionObject *pbVar3;
  undefined8 uVar4;
  btCollisionObjectWrapper *in_RCX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  btCollisionObjectWrapper *in_R8;
  byte in_R9B;
  btCollisionObjectWrapper *boxObjWrap;
  btCollisionObjectWrapper *sphereObjWrap;
  btCollisionObjectWrapper *in_stack_ffffffffffffff58;
  btCollisionObjectWrapper *in_stack_ffffffffffffff60;
  btCollisionAlgorithmConstructionInfo *in_stack_ffffffffffffff68;
  long *plVar5;
  btActivatingCollisionAlgorithm *in_stack_ffffffffffffff70;
  btCollisionObjectWrapper *local_68;
  btCollisionObjectWrapper *local_60;
  
  btActivatingCollisionAlgorithm::btActivatingCollisionAlgorithm
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  *in_RDI = &PTR__btSphereBoxCollisionAlgorithm_002e39b8;
  *(undefined1 *)(in_RDI + 2) = 0;
  in_RDI[3] = in_RSI;
  *(byte *)(in_RDI + 4) = in_R9B & 1;
  local_60 = in_RCX;
  if ((*(byte *)(in_RDI + 4) & 1) != 0) {
    local_60 = in_R8;
  }
  local_68 = in_R8;
  if ((*(byte *)(in_RDI + 4) & 1) != 0) {
    local_68 = in_RCX;
  }
  if (in_RDI[3] == 0) {
    plVar5 = (long *)in_RDI[1];
    pbVar2 = btCollisionObjectWrapper::getCollisionObject(local_60);
    pbVar3 = btCollisionObjectWrapper::getCollisionObject(local_68);
    bVar1 = (**(code **)(*plVar5 + 0x30))(plVar5,pbVar2,pbVar3);
    if ((bVar1 & 1) != 0) {
      plVar5 = (long *)in_RDI[1];
      pbVar2 = btCollisionObjectWrapper::getCollisionObject(local_60);
      pbVar3 = btCollisionObjectWrapper::getCollisionObject(local_68);
      uVar4 = (**(code **)(*plVar5 + 0x18))(plVar5,pbVar2,pbVar3);
      in_RDI[3] = uVar4;
      *(undefined1 *)(in_RDI + 2) = 1;
    }
  }
  return;
}

Assistant:

btSphereBoxCollisionAlgorithm::btSphereBoxCollisionAlgorithm(btPersistentManifold* mf,const btCollisionAlgorithmConstructionInfo& ci,const btCollisionObjectWrapper* col0Wrap,const btCollisionObjectWrapper* col1Wrap, bool isSwapped)
: btActivatingCollisionAlgorithm(ci,col0Wrap,col1Wrap),
m_ownManifold(false),
m_manifoldPtr(mf),
m_isSwapped(isSwapped)
{
	const btCollisionObjectWrapper* sphereObjWrap = m_isSwapped? col1Wrap : col0Wrap;
	const btCollisionObjectWrapper* boxObjWrap = m_isSwapped? col0Wrap : col1Wrap;
	
	if (!m_manifoldPtr && m_dispatcher->needsCollision(sphereObjWrap->getCollisionObject(),boxObjWrap->getCollisionObject()))
	{
		m_manifoldPtr = m_dispatcher->getNewManifold(sphereObjWrap->getCollisionObject(),boxObjWrap->getCollisionObject());
		m_ownManifold = true;
	}
}